

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O2

bool __thiscall
Kernel::InterpretedLiteralEvaluator::IntEvaluator::tryEvaluateBinaryPred
          (IntEvaluator *this,Interpretation op,Value *arg1,Value *arg2,bool *res)

{
  bool bVar1;
  
  switch(op) {
  case INT_GREATER:
    bVar1 = operator>(arg1,arg2);
    break;
  case INT_GREATER_EQUAL:
    bVar1 = operator>=(arg1,arg2);
    break;
  case INT_LESS:
    bVar1 = Kernel::operator<(arg1,arg2);
    break;
  case INT_LESS_EQUAL:
    bVar1 = operator<=(arg1,arg2);
    break;
  case INT_DIVIDES:
    bVar1 = IntegerConstantType::divides(arg1,arg2);
    break;
  default:
    return false;
  }
  *res = bVar1;
  return true;
}

Assistant:

virtual bool tryEvaluateBinaryPred(Interpretation op, const Value& arg1,
      const Value& arg2, bool& res)
  {
    switch(op) {
    case Theory::INT_GREATER:
      res = arg1>arg2;
      return true;
    case Theory::INT_GREATER_EQUAL:
      res = arg1>=arg2;
      return true;
    case Theory::INT_LESS:
      res = arg1<arg2;
      return true;
    case Theory::INT_LESS_EQUAL:
      res = arg1<=arg2;
      return true;
    case Theory::INT_DIVIDES:
      res = arg1.divides(arg2);
      return true;
    default:
      return false;
    }
  }